

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  ulong uVar1;
  int iVar2;
  int __fd;
  int *piVar3;
  __sighandler_t p_Var4;
  int fd;
  ulong uVar5;
  sigset_t set;
  sigset_t local_b0;
  
  uVar1 = (ulong)(uint)stdio_count;
  if ((options->flags & 8) != 0) {
    setsid();
  }
  if (0 < stdio_count) {
    uVar5 = 0;
    do {
      if ((uint)pipes[uVar5][1] < uVar5) {
        iVar2 = fcntl64((ulong)(uint)pipes[uVar5][1],0,uVar1);
        pipes[uVar5][1] = iVar2;
        if (iVar2 == -1) goto LAB_00113f34;
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  if (0 < stdio_count) {
    iVar2 = 0;
    do {
      __fd = pipes[iVar2][1];
      if (__fd < 0) {
        if (iVar2 < 3) {
          __fd = open64("/dev/null",(uint)(iVar2 != 0) * 2);
          fd = __fd;
          if (-1 < __fd) goto LAB_00113df7;
          goto LAB_00113f42;
        }
      }
      else {
        fd = pipes[iVar2][0];
LAB_00113df7:
        if (iVar2 == __fd) {
          uv__cloexec_fcntl(__fd,0);
        }
        else {
          iVar2 = dup2(__fd,iVar2);
        }
        if (iVar2 == -1) {
LAB_00113f42:
          piVar3 = __errno_location();
          iVar2 = -*piVar3;
          goto LAB_00113f58;
        }
        if (iVar2 < 3) {
          uv__nonblock_fcntl(iVar2,0);
        }
        if (stdio_count <= fd) {
          uv__close(fd);
        }
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < stdio_count);
  }
  if (0 < stdio_count) {
    uVar5 = 0;
    do {
      if (stdio_count <= pipes[uVar5][1]) {
        uv__close(pipes[uVar5][1]);
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  if (options->cwd == (char *)0x0) {
LAB_00113e77:
    if ((options->flags & 3) != 0) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      setgroups(0,(__gid_t *)0x0);
      *piVar3 = iVar2;
    }
    if ((options->flags & 2) != 0) {
      iVar2 = setgid(options->gid);
      if (iVar2 != 0) goto LAB_00113f34;
    }
    if ((options->flags & 1) != 0) {
      iVar2 = setuid(options->uid);
      if (iVar2 != 0) goto LAB_00113f34;
    }
    if (options->env != (char **)0x0) {
      _environ = options->env;
    }
    iVar2 = 1;
    do {
      if ((iVar2 != 9) && (iVar2 != 0x13)) {
        p_Var4 = signal(iVar2,(__sighandler_t)0x0);
        if (p_Var4 == (__sighandler_t)0xffffffffffffffff) goto LAB_00113f34;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x20);
    sigemptyset(&local_b0);
    iVar2 = pthread_sigmask(2,&local_b0,(__sigset_t *)0x0);
    if (iVar2 == 0) {
      execvp(options->file,options->args);
      piVar3 = __errno_location();
      iVar2 = -*piVar3;
    }
    else {
      iVar2 = -iVar2;
    }
  }
  else {
    iVar2 = chdir(options->cwd);
    if (iVar2 == 0) goto LAB_00113e77;
LAB_00113f34:
    piVar3 = __errno_location();
    iVar2 = -*piVar3;
  }
LAB_00113f58:
  uv__write_int(error_fd,iVar2);
  _exit(0x7f);
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  sigset_t set;
  int close_fd;
  int use_fd;
  int err;
  int fd;
  int n;

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
    if (pipes[fd][1] == -1) {
      uv__write_int(error_fd, UV__ERR(errno));
      _exit(127);
    }
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = pipes[fd][0];
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set
         */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0) {
          uv__write_int(error_fd, UV__ERR(errno));
          _exit(127);
        }
      }
    }

    if (fd == use_fd)
      uv__cloexec_fcntl(use_fd, 0);
    else
      fd = dup2(use_fd, fd);

    if (fd == -1) {
      uv__write_int(error_fd, UV__ERR(errno));
      _exit(127);
    }

    if (fd <= 2)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];

    if (use_fd >= stdio_count)
      uv__close(use_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if (options->env != NULL) {
    environ = options->env;
  }

  /* Reset signal disposition.  Use a hard-coded limit because NSIG
   * is not fixed on Linux: it's either 32, 34 or 64, depending on
   * whether RT signals are enabled.  We are not allowed to touch
   * RT signal handlers, glibc uses them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  /* Reset signal mask. */
  sigemptyset(&set);
  err = pthread_sigmask(SIG_SETMASK, &set, NULL);

  if (err != 0) {
    uv__write_int(error_fd, UV__ERR(err));
    _exit(127);
  }

  execvp(options->file, options->args);
  uv__write_int(error_fd, UV__ERR(errno));
  _exit(127);
}